

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLPrinter::PrintString(XMLPrinter *this,char *p,bool restricted)

{
  byte bVar1;
  size_t size;
  long lVar2;
  char *pcVar3;
  size_t size_00;
  
  if (this->_processEntities == true) {
    bVar1 = *p;
    pcVar3 = p;
    if (bVar1 != 0) {
      do {
        if ((bVar1 < 0x40) && (this->_entityFlag[(ulong)bVar1 + (ulong)restricted * 0x40] == true))
        {
          for (; p < pcVar3; p = p + size) {
            size = (long)pcVar3 - (long)p;
            if (0x7ffffffe < size) {
              size = 0x7fffffff;
            }
            Write(this,p,size);
          }
          lVar2 = 0xc;
          do {
            if (*(char *)((long)&entities + lVar2) == *pcVar3) {
              Putc(this,'&');
              Write(this,*(char **)((long)&std::__detail::
                                           _BracketMatcher<std::__cxx11::regex_traits<char>,true,true>
                                           ::typeinfo + lVar2 + 4),
                    (long)*(int *)((long)&PTR_typeinfo_name_0014a578 + lVar2 + 4));
              Putc(this,';');
              break;
            }
            lVar2 = lVar2 + 0x10;
          } while (lVar2 != 0x5c);
          p = p + 1;
        }
        bVar1 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
      } while (bVar1 != 0);
    }
    if (pcVar3 <= p) {
      return;
    }
    size_00 = (long)pcVar3 - (long)p;
    if (0x7ffffffe < size_00) {
      size_00 = 0x7fffffff;
    }
  }
  else {
    size_00 = strlen(p);
  }
  Write(this,p,size_00);
  return;
}

Assistant:

void XMLPrinter::PrintString( const char* p, bool restricted )
{
    // Look for runs of bytes between entities to print.
    const char* q = p;

    if ( _processEntities ) {
        const bool* flag = restricted ? _restrictedEntityFlag : _entityFlag;
        while ( *q ) {
            TIXMLASSERT( p <= q );
            // Remember, char is sometimes signed. (How many times has that bitten me?)
            if ( *q > 0 && *q < ENTITY_RANGE ) {
                // Check for entities. If one is found, flush
                // the stream up until the entity, write the
                // entity, and keep looking.
                if ( flag[static_cast<unsigned char>(*q)] ) {
                    while ( p < q ) {
                        const size_t delta = q - p;
                        const int toPrint = ( INT_MAX < delta ) ? INT_MAX : static_cast<int>(delta);
                        Write( p, toPrint );
                        p += toPrint;
                    }
                    bool entityPatternPrinted = false;
                    for( int i=0; i<NUM_ENTITIES; ++i ) {
                        if ( entities[i].value == *q ) {
                            Putc( '&' );
                            Write( entities[i].pattern, entities[i].length );
                            Putc( ';' );
                            entityPatternPrinted = true;
                            break;
                        }
                    }
                    if ( !entityPatternPrinted ) {
                        // TIXMLASSERT( entityPatternPrinted ) causes gcc -Wunused-but-set-variable in release
                        TIXMLASSERT( false );
                    }
                    ++p;
                }
            }
            ++q;
            TIXMLASSERT( p <= q );
        }
        // Flush the remaining string. This will be the entire
        // string if an entity wasn't found.
        if ( p < q ) {
            const size_t delta = q - p;
            const int toPrint = ( INT_MAX < delta ) ? INT_MAX : static_cast<int>(delta);
            Write( p, toPrint );
        }
    }
    else {
        Write( p );
    }
}